

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void NavClampRectToVisibleAreaForMoveDir(ImGuiDir move_dir,ImRect *r,ImRect *clip_rect)

{
  float fVar1;
  ImRect *clip_rect_local;
  ImRect *r_local;
  ImGuiDir move_dir_local;
  
  if ((move_dir == 0) || (move_dir == 1)) {
    fVar1 = ImClamp<float>((r->Min).y,(clip_rect->Min).y,(clip_rect->Max).y);
    (r->Min).y = fVar1;
    fVar1 = ImClamp<float>((r->Max).y,(clip_rect->Min).y,(clip_rect->Max).y);
    (r->Max).y = fVar1;
  }
  else {
    fVar1 = ImClamp<float>((r->Min).x,(clip_rect->Min).x,(clip_rect->Max).x);
    (r->Min).x = fVar1;
    fVar1 = ImClamp<float>((r->Max).x,(clip_rect->Min).x,(clip_rect->Max).x);
    (r->Max).x = fVar1;
  }
  return;
}

Assistant:

static void inline NavClampRectToVisibleAreaForMoveDir(ImGuiDir move_dir, ImRect& r, const ImRect& clip_rect)
{
    if (move_dir == ImGuiDir_Left || move_dir == ImGuiDir_Right)
    {
        r.Min.y = ImClamp(r.Min.y, clip_rect.Min.y, clip_rect.Max.y);
        r.Max.y = ImClamp(r.Max.y, clip_rect.Min.y, clip_rect.Max.y);
    }
    else
    {
        r.Min.x = ImClamp(r.Min.x, clip_rect.Min.x, clip_rect.Max.x);
        r.Max.x = ImClamp(r.Max.x, clip_rect.Min.x, clip_rect.Max.x);
    }
}